

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm_bitreader.h
# Opt level: O1

unsigned_long __thiscall LLVMBC::BitReader::vbr<unsigned_long>(BitReader *this,size_t groupBitSize)

{
  unsigned_long uVar1;
  ulong uVar2;
  uint uVar3;
  byte scratch [8];
  byte local_40 [8];
  BitReader *local_38;
  
  local_38 = this;
  if (groupBitSize < 2) {
    __assert_fail("groupBitSize > 1 && \"chunk size must be greater than 1\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                  ,0x61,"T LLVMBC::BitReader::vbr(const size_t) [T = unsigned long]");
  }
  if (groupBitSize < 9) {
    uVar3 = 1 << ((byte)(groupBitSize - 1) & 0x1f);
    local_40[0] = 0;
    local_40[1] = 0;
    local_40[2] = 0;
    local_40[3] = 0;
    local_40[4] = 0;
    local_40[5] = 0;
    local_40[6] = 0;
    local_40[7] = 0;
    uVar2 = 0;
    uVar1 = 0;
    do {
      ReadBits(local_38,groupBitSize,local_40);
      if (0x3f < uVar2) {
        __assert_fail("shift <= 63",
                      "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                      ,0x6f,"T LLVMBC::BitReader::vbr(const size_t) [T = unsigned long]");
      }
      uVar1 = uVar1 + ((ulong)(uVar3 + 0xff & (uint)local_40[0]) << ((byte)uVar2 & 0x3f));
      uVar2 = uVar2 + (groupBitSize - 1);
    } while ((uVar3 & local_40[0]) != 0);
    return uVar1;
  }
  __assert_fail("groupBitSize <= 8 && \"Only chunk sizes up to 8 supported\"",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/bc-decoder/llvm_bitreader.h"
                ,0x62,"T LLVMBC::BitReader::vbr(const size_t) [T = unsigned long]");
}

Assistant:

T vbr(const size_t groupBitSize)
  {
    uint64_t ret = 0;

    assert(groupBitSize > 1 && "chunk size must be greater than 1");
    assert(groupBitSize <= 8 && "Only chunk sizes up to 8 supported");

    // Avoid false positive warning.
    byte scratch[8] = {};

    const byte hibit = 1 << (groupBitSize - 1);
    const byte lobits = hibit - 1;

    uint64_t shift = 0;
    do
    {
      ReadBits(groupBitSize, scratch);

      assert(shift <= 63);

      ret += (uint64_t(scratch[0] & lobits) << shift);

      shift += uint64_t(groupBitSize - 1);
    } while(scratch[0] & hibit);

#ifndef NDEBUG
    // check for overflow of the return type
    const uint64_t mask = ((1ULL << (sizeof(T) * 8 - 1)) - 1) << 1 | 1;
    assert((ret & mask) == ret);
#endif

    return T(ret);
  }